

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O0

int ON_InsertKnot(double knot_value,int knot_multiplicity,int cv_dim,int order,int cv_count,
                 int cv_stride,double *cv,double *knot,int *hint)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  int cv_count_00;
  int iVar4;
  double *knot_00;
  int local_94;
  int local_74;
  int local_70;
  int j_local;
  int i1;
  int i0;
  double *new_cv;
  double *new_knot;
  int local_50;
  int j;
  int m;
  int degree;
  double knot_tolerance;
  int span_index;
  int rc;
  double *cv_local;
  int cv_stride_local;
  int cv_count_local;
  int order_local;
  int cv_dim_local;
  int knot_multiplicity_local;
  double knot_value_local;
  
  if (((order < 2) || (cv_count < order)) || (knot == (double *)0x0)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_knot.cpp"
               ,0x521,"","ON_InsertKnot(): illegal input");
    knot_value_local._4_4_ = 0;
  }
  else if ((cv == (double *)0x0) || ((0 < cv_dim && (cv_dim <= cv_stride)))) {
    if (knot_multiplicity < order) {
      if (hint == (int *)0x0) {
        local_94 = 0;
      }
      else {
        local_94 = *hint;
      }
      iVar3 = ON_NurbsSpanIndex(order,cv_count,knot,knot_value,1,local_94);
      knot_00 = knot + iVar3;
      _span_index = cv;
      if (cv != (double *)0x0) {
        _span_index = cv + iVar3 * cv_stride;
      }
      cv_count_00 = cv_count - iVar3;
      dVar1 = ON_SpanTolerance(order,cv_count_00,knot_00,0);
      if (((iVar3 != 0) || (knot_00[order + -1] <= knot_value)) ||
         (knot_00[order + -2] + dVar1 < knot_value)) {
        if (((iVar3 != cv_count_00 - order) ||
            (knot_value < knot_00[order + -2] || knot_value == knot_00[order + -2])) ||
           (knot_value < knot_00[order + -1] - dVar1)) {
          if (((knot_00[order + -2] + knot_00[order + -1]) * 0.5 < knot_value) ||
             (dVar1 < ABS(knot_value - knot_00[order + -2]))) {
            _cv_dim_local = knot_value;
            if (ABS(knot_value - knot_00[order + -1]) <= dVar1) {
              _cv_dim_local = knot_00[order + -1];
            }
          }
          else {
            _cv_dim_local = knot_00[order + -2];
          }
          iVar4 = order + -1;
          local_50 = 0;
          if ((_cv_dim_local != knot_00[order + -2]) ||
             (NAN(_cv_dim_local) || NAN(knot_00[order + -2]))) {
            if ((_cv_dim_local == knot_00[order + -1]) &&
               (!NAN(_cv_dim_local) && !NAN(knot_00[order + -1]))) {
              while( true ) {
                bVar2 = false;
                if (local_50 < knot_multiplicity) {
                  bVar2 = knot_00[order + -1 + local_50] == _cv_dim_local;
                }
                if (!bVar2) break;
                local_50 = local_50 + 1;
              }
            }
          }
          else {
            while( true ) {
              bVar2 = false;
              if (local_50 < knot_multiplicity) {
                bVar2 = knot_00[(order + -2) - local_50] == _cv_dim_local;
              }
              if (!bVar2) break;
              local_50 = local_50 + 1;
            }
          }
          local_50 = knot_multiplicity - local_50;
          if (hint != (int *)0x0) {
            *hint = iVar3 + local_50;
          }
          if (local_50 < 1) {
            knot_value_local._4_4_ = 0;
          }
          else {
            new_cv = (double *)
                     onmalloc((long)(iVar4 * 2 + local_50 + (order + local_50) * cv_dim) << 3);
            if (new_cv == (double *)0x0) {
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_knot.cpp"
                         ,0x570,"","ON_InsertKnot(): out of memory");
              knot_value_local._4_4_ = 0;
            }
            else {
              _i1 = (double *)0x0;
              memcpy(new_cv,knot_00,(long)(iVar4 * 2) << 3);
              if (_span_index != (double *)0x0) {
                _i1 = new_cv + (iVar4 * 2 + local_50);
                for (new_knot._4_4_ = 0; new_knot._4_4_ < order; new_knot._4_4_ = new_knot._4_4_ + 1
                    ) {
                  memcpy(_i1 + new_knot._4_4_ * cv_dim,_span_index + new_knot._4_4_ * cv_stride,
                         (long)cv_dim << 3);
                }
              }
              knot_tolerance._4_4_ = 0;
              while ((0 < local_50 &&
                     (bVar2 = ON_InsertSingleKnot(cv_dim,order,cv_dim,_i1,new_cv,_cv_dim_local),
                     bVar2))) {
                local_50 = local_50 + -1;
                if (_i1 != (double *)0x0) {
                  _i1 = _i1 + cv_stride;
                }
                new_cv = new_cv + 1;
                knot_tolerance._4_4_ = knot_tolerance._4_4_ + 1;
              }
              _i1 = _i1 + -(long)(knot_tolerance._4_4_ * cv_stride);
              if (0 < knot_tolerance._4_4_) {
                iVar3 = ON_KnotCount(order,cv_count_00);
                local_74 = cv_count_00 - order;
                local_70 = iVar3 + -1 + knot_tolerance._4_4_;
                j_local = iVar3 + -1;
                while (local_74 != 0) {
                  knot_00[local_70] = knot_00[j_local];
                  local_74 = local_74 + -1;
                  local_70 = local_70 + -1;
                  j_local = j_local + -1;
                }
                memcpy(knot_00 + iVar4,new_cv + -(long)knot_tolerance._4_4_ + iVar4,
                       (long)(iVar4 + knot_tolerance._4_4_) << 3);
                if (_span_index != (double *)0x0) {
                  j_local = (cv_count_00 + -1) * cv_stride;
                  local_70 = j_local + knot_tolerance._4_4_ * cv_stride;
                  local_74 = cv_count_00 - order;
                  while (local_74 != 0) {
                    memcpy(_span_index + local_70,_span_index + j_local,(long)cv_dim << 3);
                    local_70 = local_70 - cv_stride;
                    j_local = j_local - cv_stride;
                    local_74 = local_74 + -1;
                  }
                  for (local_74 = 0; local_74 < order + knot_tolerance._4_4_;
                      local_74 = local_74 + 1) {
                    memcpy(_span_index,_i1,(long)cv_dim << 3);
                    _span_index = _span_index + cv_stride;
                    _i1 = _i1 + cv_dim;
                  }
                }
              }
              onfree(new_cv + -(long)knot_tolerance._4_4_);
              knot_value_local._4_4_ = knot_tolerance._4_4_;
            }
          }
        }
        else {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_knot.cpp"
                     ,0x54d,"","ON_InsertKnot(): requested knot_value at end of NURBS domain");
          knot_value_local._4_4_ = 0;
        }
      }
      else {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_knot.cpp"
                   ,0x544,"","ON_InsertKnot(): requested knot_value at start of NURBS domain");
        knot_value_local._4_4_ = 0;
      }
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_knot.cpp"
                 ,0x530,"","ON_InsertKnot(): requested knot_multiplicity > degree");
      knot_value_local._4_4_ = 0;
    }
  }
  else {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_knot.cpp"
               ,0x529,"","ON_InsertKnot(): illegal input");
    knot_value_local._4_4_ = 0;
  }
  return knot_value_local._4_4_;
}

Assistant:

int ON_InsertKnot( 
        double knot_value, 
        int knot_multiplicity, 
        int cv_dim,   // dimension of cv's = ( = dim+1 for rational cvs )
        int order, 
        int cv_count,
        int cv_stride, 
        double* cv,   // nullptr or cv array with room for at least knot_multiplicity new cvs
        double* knot, // knot array with room for at least knot_multiplicity new knots
        int* hint     // optional hint about where to search for span to add knots to
                      // pass nullptr if no hint is available
        )
{
  int rc = 0; // return code = number of knots added

  if ( order < 2 || cv_count < order || !knot ) 
  {
    ON_ERROR("ON_InsertKnot(): illegal input" );
    return 0;
  }

  if ( cv ) 
  {
    if ( cv_dim < 1 || cv_stride < cv_dim ) 
    {
      ON_ERROR("ON_InsertKnot(): illegal input" );
      return 0;
    }
  }

  if ( knot_multiplicity >= order ) 
  {
    ON_ERROR("ON_InsertKnot(): requested knot_multiplicity > degree" );
    return 0;
  }

  // shift knot vector and cv array so that knot_value lies in first span
  int span_index = ON_NurbsSpanIndex( order, cv_count, knot, knot_value, 1, hint?*hint:0 );
  knot += span_index;
  if ( cv )
    cv += (span_index*cv_stride);
  cv_count -= span_index;

  const double knot_tolerance = ON_SpanTolerance( order, cv_count, knot, 0 );

  // check that knot_value is interior to NURBS domain
  if ( span_index == 0 ) 
  {
    if ( knot_value < knot[order-1] ) 
    {
      if ( knot_value <= knot[order-2] + knot_tolerance ) 
      {
        ON_ERROR("ON_InsertKnot(): requested knot_value at start of NURBS domain" );
        return 0;
      }
    }
  }
  if ( span_index == cv_count-order ) 
  {
    if ( knot_value > knot[order-2] && knot_value >= knot[order-1] - knot_tolerance ) 
    {
      ON_ERROR("ON_InsertKnot(): requested knot_value at end of NURBS domain" );
      return 0;
    }
  }

  // if knot_value is nearly equal to an existing knot, make it exactly equal
  if ( knot_value <= 0.5*(knot[order-2]+knot[order-1]) && fabs( knot_value - knot[order-2] ) <= knot_tolerance ) {
    knot_value = knot[order-2];
  }
  else if ( fabs( knot_value - knot[order-1] ) <= knot_tolerance ) {
    knot_value = knot[order-1];
  }

  const int degree = order-1;

  // set m = number of knots to add
  int m = 0; 
  int j;
  if ( knot_value == knot[order-2] ) {
    for ( j = order-2; m < knot_multiplicity && knot[j-m] == knot_value; m++ )
      ; // empty for
  }
  else if ( knot_value == knot[order-1] ) {
    for ( j = order-1; m < knot_multiplicity && knot[j+m] == knot_value; m++ )
      ; // empty for
  }
  m = knot_multiplicity - m;
  if ( hint )
    *hint = span_index+m;

  if ( m <= 0 )
    return 0; // no knots need to be added

  double* new_knot = (double*)onmalloc( ((2*degree+m) + (order+m)*cv_dim)*sizeof(*new_knot) );
  if ( !new_knot ) {
    ON_ERROR("ON_InsertKnot(): out of memory");
    return 0;
  }
  double* new_cv = 0;
  memcpy( new_knot, knot, 2*degree*sizeof(*new_knot) );
  if ( cv ) {
    new_cv = new_knot + (2*degree+m);
    for ( j = 0; j < order; j++ ) {
      memcpy( new_cv + j*cv_dim, cv + j*cv_stride, cv_dim*sizeof(*new_cv) );
    }
  }

  // add m more knots at knot_value
  rc = 0;
  while (m>0) {
    if ( !ON_InsertSingleKnot(cv_dim,order,cv_dim,new_cv,new_knot,knot_value) )
      break;
    m--;
    if ( new_cv )
      new_cv += cv_stride; 
    new_knot++; 
    rc++;
  }
  new_knot -= rc;
  new_cv -= rc*cv_stride;

  if ( rc > 0 ) 
  {
    // make room for rc many new knots
    int i0 = ON_KnotCount( order, cv_count ) - 1; // knot[i0] = last input knot
    int i1 = i0 + rc;
    int j_local  = (cv_count-order);
    while (j_local--)
      knot[i1--] = knot[i0--];
    
    // update knot vector
    memcpy ( knot+degree, new_knot+degree, (degree+rc)*sizeof(*new_knot) );

    if ( cv ) {
      // make room for rc many new CVs
      i0 = (cv_count-1)*cv_stride;             // cv[i0] = last coord of last input cv */
      i1 = i0 + rc*cv_stride;
      j_local = cv_count-order;
      while (j_local--) {
        memcpy( cv+i1, cv+i0, cv_dim*sizeof(*cv) );
        i1 -= cv_stride;
        i0 -= cv_stride;
      }

      // update cv values
      for ( j_local = 0; j_local < order+rc; j_local++ ) {
        memcpy( cv, new_cv, cv_dim*sizeof(*new_cv) );
        cv += cv_stride;
        new_cv += cv_dim;
      }
    }

  }

  onfree(new_knot);

  return rc;
}